

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.h
# Opt level: O0

bool __thiscall Ptex::v2_4::PtexCachedReader::tryPurge(PtexCachedReader *this,size_t *memUsedChange)

{
  bool bVar1;
  size_t sVar2;
  size_t *in_RSI;
  PtexCachedReader *in_RDI;
  PtexReader *in_stack_00000090;
  
  bVar1 = trylock(in_RDI);
  if (bVar1) {
    PtexReader::purge(in_stack_00000090);
    sVar2 = getMemUsedChange(in_RDI);
    *in_RSI = sVar2;
    unlock(in_RDI);
  }
  else {
    PtexReader::setPendingPurge(&in_RDI->super_PtexReader);
  }
  return bVar1;
}

Assistant:

bool tryPurge(size_t& memUsedChange) {
        if (trylock()) {
            purge();
            memUsedChange = getMemUsedChange();
            unlock();
            return true;
        }
        setPendingPurge();
        return false;
    }